

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

bool __thiscall
spvtools::val::anon_unknown_2::IsAllowedTypeOrArrayOfSame
          (anon_unknown_2 *this,ValidationState_t *_,Instruction *type,
          initializer_list<spv::Op> allowed)

{
  Instruction *this_00;
  Op OVar1;
  uint32_t id;
  const_iterator pOVar2;
  const_iterator pOVar3;
  Op *pOVar4;
  Op local_44;
  Instruction *local_40;
  Instruction *elem_type;
  ValidationState_t *local_30;
  Instruction *type_local;
  ValidationState_t *__local;
  initializer_list<spv::Op> allowed_local;
  
  allowed_local._M_array = allowed._M_array;
  local_30 = _;
  type_local = (Instruction *)this;
  __local = (ValidationState_t *)type;
  pOVar2 = std::initializer_list<spv::Op>::begin((initializer_list<spv::Op> *)&__local);
  pOVar3 = std::initializer_list<spv::Op>::end((initializer_list<spv::Op> *)&__local);
  elem_type._4_4_ = Instruction::opcode((Instruction *)local_30);
  pOVar4 = std::find<spv::Op_const*,spv::Op>(pOVar2,pOVar3,(Op *)((long)&elem_type + 4));
  pOVar2 = std::initializer_list<spv::Op>::end((initializer_list<spv::Op> *)&__local);
  if (pOVar4 == pOVar2) {
    OVar1 = Instruction::opcode((Instruction *)local_30);
    if ((OVar1 != OpTypeArray) &&
       (OVar1 = Instruction::opcode((Instruction *)local_30), OVar1 != OpTypeRuntimeArray)) {
      return false;
    }
    this_00 = type_local;
    id = Instruction::word((Instruction *)local_30,2);
    local_40 = ValidationState_t::FindDef((ValidationState_t *)this_00,id);
    pOVar2 = std::initializer_list<spv::Op>::begin((initializer_list<spv::Op> *)&__local);
    pOVar3 = std::initializer_list<spv::Op>::end((initializer_list<spv::Op> *)&__local);
    local_44 = Instruction::opcode(local_40);
    pOVar4 = std::find<spv::Op_const*,spv::Op>(pOVar2,pOVar3,&local_44);
    pOVar2 = std::initializer_list<spv::Op>::end((initializer_list<spv::Op> *)&__local);
    allowed_local._M_len._7_1_ = pOVar4 != pOVar2;
  }
  else {
    allowed_local._M_len._7_1_ = true;
  }
  return allowed_local._M_len._7_1_;
}

Assistant:

bool IsAllowedTypeOrArrayOfSame(ValidationState_t& _, const Instruction* type,
                                std::initializer_list<spv::Op> allowed) {
  if (std::find(allowed.begin(), allowed.end(), type->opcode()) !=
      allowed.end()) {
    return true;
  }
  if (type->opcode() == spv::Op::OpTypeArray ||
      type->opcode() == spv::Op::OpTypeRuntimeArray) {
    auto elem_type = _.FindDef(type->word(2));
    return std::find(allowed.begin(), allowed.end(), elem_type->opcode()) !=
           allowed.end();
  }
  return false;
}